

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_parser_test.cpp
# Opt level: O1

void __thiscall
bioparser::test::BioparserPafTest_ParseWhole_Test::TestBody(BioparserPafTest_ParseWhole_Test *this)

{
  Parser<bioparser::test::PafOverlap> *pPVar1;
  string local_58;
  vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  local_30;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"sample.paf","");
  BioparserPafTest::Setup(&this->super_BioparserPafTest,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  pPVar1 = (this->super_BioparserPafTest).p._M_t.
           super___uniq_ptr_impl<bioparser::Parser<bioparser::test::PafOverlap>,_std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_bioparser::Parser<bioparser::test::PafOverlap>_*,_std::default_delete<bioparser::Parser<bioparser::test::PafOverlap>_>_>
           .super__Head_base<0UL,_bioparser::Parser<bioparser::test::PafOverlap>_*,_false>.
           _M_head_impl;
  (*pPVar1->_vptr_Parser[2])(&local_30,pPVar1,0xffffffffffffffff,1);
  local_58._M_dataplus._M_p =
       (pointer)(this->super_BioparserPafTest).o.
                super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_58._M_string_length =
       (size_type)
       (this->super_BioparserPafTest).o.
       super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_58.field_2._M_allocated_capacity =
       (size_type)
       (this->super_BioparserPafTest).o.
       super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_BioparserPafTest).o.
  super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_30.
       super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_BioparserPafTest).o.
  super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_30.
       super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_BioparserPafTest).o.
  super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_30.
       super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_30.
  super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_30.
  super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30.
  super__Vector_base<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  ::~vector((vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
             *)&local_58);
  std::
  vector<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>,_std::allocator<std::unique_ptr<bioparser::test::PafOverlap,_std::default_delete<bioparser::test::PafOverlap>_>_>_>
  ::~vector(&local_30);
  BioparserPafTest::Check(&this->super_BioparserPafTest);
  return;
}

Assistant:

TEST_F(BioparserPafTest, ParseWhole) {
  Setup("sample.paf");
  o = p->Parse(-1);
  Check();
}